

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

double RDL_getNofRC(RDL_data *data)

{
  uint index;
  double dVar1;
  double dVar2;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
LAB_001054d0:
    dVar1 = 1.79769313486232e+308;
  }
  else if (data->nofURFs == 0) {
    dVar1 = 0.0;
  }
  else {
    dVar1 = 0.0;
    index = 0;
    do {
      dVar2 = RDL_getNofRCForURF(data,index);
      if ((dVar2 == 1.79769313486232e+308) && (!NAN(dVar2))) goto LAB_001054d0;
      dVar1 = dVar1 + dVar2;
      index = index + 1;
    } while (index < data->nofURFs);
  }
  return dVar1;
}

Assistant:

double RDL_getNofRC(const RDL_data *data)
{
  double result = 0, intermediate;
  unsigned i;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return RDL_INVALID_RC_COUNT;
  }

  /* add up results for URFs */
  for (i = 0; i < data->nofURFs; ++i) {
    intermediate = RDL_getNofRCForURF(data, i);
    if (intermediate == RDL_INVALID_RC_COUNT) {
      return RDL_INVALID_RC_COUNT;
    }

    result += intermediate;
  }

  return result;
}